

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O0

void cos1D_predict<IMLE<1,1,FastLinearExpert>>(IMLE<1,_1,_FastLinearExpert> *imleObj)

{
  int iVar1;
  ostream *poVar2;
  Scalar *pSVar3;
  void *pvVar4;
  CoeffReturnType pdVar5;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *this;
  IMLE<1,_1,_FastLinearExpert> *in_RDI;
  result_type_conflict1 rVar6;
  double dVar7;
  int k_3;
  int k_2;
  int nSol;
  vector<double,_std::allocator<double>_> invSol;
  Scal inv_x;
  int k_1;
  int k;
  Vec x;
  Vec z;
  int NPOINTS_QUERY;
  uniform_01<double,_double> uniform;
  mt19937 rng;
  ostream *in_stack_fffffffffffff378;
  IMLE<1,_1,_FastLinearExpert> *in_stack_fffffffffffff380;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff388;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff390;
  int local_a6c;
  undefined4 in_stack_fffffffffffff5a8;
  int iVar8;
  undefined4 in_stack_fffffffffffff5ac;
  IMLE<1,_1,_FastLinearExpert> *in_stack_fffffffffffff5b0;
  int local_a24;
  int local_a18;
  uniform_01<double,_double> local_9d1 [2505];
  IMLE<1,_1,_FastLinearExpert> *local_8;
  
  local_8 = in_RDI;
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
              *)0x23617c);
  boost::random::uniform_01<double,_double>::uniform_01(local_9d1);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff390._M_current,
             (int *)in_stack_fffffffffffff388._M_current);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff390._M_current,
             (int *)in_stack_fffffffffffff388._M_current);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\t --- Forward Prediction (random input locations): ---");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  for (local_a18 = 0; local_a18 < 10; local_a18 = local_a18 + 1) {
    rVar6 = boost::random::detail::new_uniform_01<double>::operator()
                      ((new_uniform_01<double> *)in_stack_fffffffffffff390._M_current,
                       (mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
                        *)in_stack_fffffffffffff388._M_current);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    *pSVar3 = rVar6 * 4.0 * 3.141592653589793;
    Eigen::Matrix<double,1,1,0,1,1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffff380,
               (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff378);
    IMLE<1,_1,_FastLinearExpert>::predict
              (in_stack_fffffffffffff5b0,
               (Z *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff380,
               (DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffff378);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t cos(");
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pSVar3);
    poVar2 = std::operator<<(poVar2,") = ");
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    dVar7 = cos(*pSVar3);
    pvVar4 = (void *)std::ostream::operator<<(poVar2,dVar7);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\tpred(");
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pSVar3);
    poVar2 = std::operator<<(poVar2,") = ");
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pSVar3);
    poVar2 = std::operator<<(poVar2,"  (error = ");
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    dVar7 = cos(*pSVar3);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar7 - *pSVar3);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t\t    Jacobian(");
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pSVar3);
    poVar2 = std::operator<<(poVar2,") = ");
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    dVar7 = sin(*pSVar3);
    pvVar4 = (void *)std::ostream::operator<<(poVar2,-dVar7);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t\tpredJacobian(");
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pSVar3);
    poVar2 = std::operator<<(poVar2,") = ");
    IMLE<1,_1,_FastLinearExpert>::getPredictionJacobian(in_stack_fffffffffffff380);
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378,0x2366d5);
    pvVar4 = (void *)std::ostream::operator<<(poVar2,*pdVar5);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\t --- Inverse Prediction (random output locations): ---");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  for (local_a24 = 0; local_a24 < 10; local_a24 = local_a24 + 1) {
    rVar6 = boost::random::detail::new_uniform_01<double>::operator()
                      ((new_uniform_01<double> *)in_stack_fffffffffffff390._M_current,
                       (mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
                        *)in_stack_fffffffffffff388._M_current);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    *pSVar3 = rVar6 + rVar6 + -1.0;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    dVar7 = acos(*pSVar3);
    Eigen::Matrix<double,1,1,0,1,1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffff380,
               (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff378);
    IMLE<1,_1,_FastLinearExpert>::predictInverse
              ((IMLE<1,_1,_FastLinearExpert> *)in_stack_fffffffffffff390._M_current,
               (X *)in_stack_fffffffffffff388._M_current);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x2368a0);
    iVar1 = IMLE<1,_1,_FastLinearExpert>::getNumberOfInverseSolutionsFound(local_8);
    for (iVar8 = 0; iVar8 < iVar1; iVar8 = iVar8 + 1) {
      this = &IMLE<1,_1,_FastLinearExpert>::getInversePredictions(local_8)->
              super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ;
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::operator[](this,(long)iVar8);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0> *)
                 in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff390._M_current,
                 in_stack_fffffffffffff388._M_current);
    }
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff378);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff378);
    std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_fffffffffffff390,in_stack_fffffffffffff388);
    poVar2 = std::operator<<((ostream *)&std::cout,"\tinvCos(");
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pSVar3);
    poVar2 = std::operator<<(poVar2,") = ( ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar7);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,6.283185307179586 - dVar7);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar7 + 6.283185307179586);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,12.566370614359172 - dVar7);
    poVar2 = std::operator<<(poVar2," )");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t  pred(");
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    in_stack_fffffffffffff390._M_current = (double *)std::ostream::operator<<(poVar2,*pSVar3);
    std::operator<<((ostream *)in_stack_fffffffffffff390._M_current,") = ( ");
    for (local_a6c = 0; local_a6c < iVar1; local_a6c = local_a6c + 1) {
      in_stack_fffffffffffff388._M_current =
           std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)&stack0xfffffffffffff5b0,
                      (long)local_a6c);
      in_stack_fffffffffffff380 =
           (IMLE<1,_1,_FastLinearExpert> *)
           std::ostream::operator<<
                     (&std::cout,
                      *(double *)
                       ((mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
                         *)in_stack_fffffffffffff388._M_current)->x);
      std::operator<<((ostream *)in_stack_fffffffffffff380,", ");
    }
    in_stack_fffffffffffff378 = std::operator<<((ostream *)&std::cout,")");
    std::ostream::operator<<(in_stack_fffffffffffff378,std::endl<char,std::char_traits<char>>);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)poVar2);
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x236c9a);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x236ca9);
  return;
}

Assistant:

void cos1D_predict( Learner &imleObj)
{
    // Random number generation
    boost::mt19937 rng;
    boost::uniform_01<Scal> uniform;
    // Query dataset size
    const int NPOINTS_QUERY = 10;
    // Input and output Eigen vectors
    Vec z(1), x(1);

    // Forward Prediction
    cout << "\t --- Forward Prediction (random input locations): ---" << endl;
    for(int k = 0; k < NPOINTS_QUERY; k++)
    {
        z[0] = uniform(rng) * 4*M_PI;

        x = imleObj.predict(z);
        // Alternatively:
        //      imleObj.predict();
        //      x = getPrediction()[0];

        cout << "\t cos(" << z[0] << ") = " << cos(z[0]) << endl;
        cout << "\tpred(" << z[0] << ") = " << x[0] << "  (error = " << cos(z[0])-x[0] << ")" << endl;
        cout << "\t\t    Jacobian(" << z[0] << ") = " << -sin(z[0]) << endl;
        cout << "\t\tpredJacobian(" << z[0] << ") = " << imleObj.getPredictionJacobian()(0,0) << endl;
    }

    // Inverse Prediction
    cout << "\t --- Inverse Prediction (random output locations): ---" << endl;
    for(int k = 0; k < NPOINTS_QUERY; k++)
    {
        x[0] = uniform(rng) * 2.0 - 1.0;
        Scal inv_x = acos(x[0]);

        imleObj.predictInverse(x);

        vector<Scal> invSol;
        int nSol = imleObj.getNumberOfInverseSolutionsFound();
        for( int k = 0; k < nSol; k++ )
            invSol.push_back( imleObj.getInversePredictions()[k][0] );
        sort(invSol.begin(), invSol.end() );

        cout << "\tinvCos(" << x[0] << ") = ( " << inv_x << ", " << 2.0*M_PI-inv_x << ", " << 2.0*M_PI+inv_x << ", " << 4.0*M_PI-inv_x << " )" << endl;
        cout << "\t  pred(" << x[0] << ") = ( ";
        for( int k = 0; k < nSol; k++ )
            cout << invSol[k] << ", ";
        cout << ")" << endl;
    }
}